

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

void deqp::gles3::Performance::anon_unknown_1::generateLayeredGridVertexAttribData4C4V
               (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *vertexData,
               LayeredGridSpec *scene)

{
  int iVar1;
  pointer pVVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined1 **ppuVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  Vec4 yellow;
  Vec4 green;
  undefined1 *local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_28 = 0x3f80000000000000;
  uStack_20 = 0x3f33333300000000;
  local_38 = &DAT_3f8000003f800000;
  uStack_30 = 0x3f4ccccd00000000;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (vertexData,(long)(scene->gridWidth * scene->gridHeight * scene->gridLayers * 0xc));
  if (0 < scene->gridHeight) {
    iVar4 = 0;
    do {
      if (0 < scene->gridWidth) {
        iVar5 = 0;
        iVar6 = iVar4;
        do {
          iVar9 = scene->gridLayers;
          if (0 < iVar9) {
            iVar7 = 0;
            do {
              iVar1 = scene->gridHeight;
              ppuVar8 = &local_38;
              if ((iVar6 + iVar7 & 1U) == 0) {
                ppuVar8 = (undefined1 **)&local_28;
              }
              fVar13 = (float)scene->gridWidth;
              fVar11 = (float)iVar5 / fVar13 + -0.5;
              uVar3 = ppuVar8[1];
              fVar10 = (float)(iVar4 + 1) / (float)iVar1 + -0.5;
              pVVar2 = (vertexData->
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       )._M_impl.super__Vector_impl_data._M_start +
                       ((scene->gridWidth * iVar4 + iVar5) * iVar9 + iVar7) * 0xc;
              *(undefined1 **)pVVar2->m_data = *ppuVar8;
              *(undefined8 *)(pVVar2->m_data + 2) = uVar3;
              fVar11 = fVar11 + fVar11;
              fVar10 = fVar10 + fVar10;
              iVar9 = ((scene->gridWidth * iVar4 + iVar5) * scene->gridLayers + iVar7) * 0xc + 1;
              pVVar2 = (vertexData->
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pVVar2[iVar9].m_data[0] = fVar11;
              pVVar2[iVar9].m_data[1] = fVar10;
              pVVar2[iVar9].m_data[2] = 0.0;
              pVVar2[iVar9].m_data[3] = 1.0;
              uVar3 = ppuVar8[1];
              pVVar2 = (vertexData->
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       )._M_impl.super__Vector_impl_data._M_start +
                       (((scene->gridWidth * iVar4 + iVar5) * scene->gridLayers + iVar7) * 0xc + 2);
              *(undefined1 **)pVVar2->m_data = *ppuVar8;
              *(undefined8 *)(pVVar2->m_data + 2) = uVar3;
              fVar12 = (float)iVar4 / (float)iVar1 + -0.5;
              fVar12 = fVar12 + fVar12;
              iVar9 = ((scene->gridWidth * iVar4 + iVar5) * scene->gridLayers + iVar7) * 0xc + 3;
              pVVar2 = (vertexData->
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pVVar2[iVar9].m_data[0] = fVar11;
              pVVar2[iVar9].m_data[1] = fVar12;
              pVVar2[iVar9].m_data[2] = 0.0;
              pVVar2[iVar9].m_data[3] = 1.0;
              uVar3 = ppuVar8[1];
              pVVar2 = (vertexData->
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       )._M_impl.super__Vector_impl_data._M_start +
                       (((scene->gridWidth * iVar4 + iVar5) * scene->gridLayers + iVar7) * 0xc + 4);
              *(undefined1 **)pVVar2->m_data = *ppuVar8;
              *(undefined8 *)(pVVar2->m_data + 2) = uVar3;
              fVar13 = (float)(iVar5 + 1) / fVar13 + -0.5;
              fVar13 = fVar13 + fVar13;
              iVar9 = ((scene->gridWidth * iVar4 + iVar5) * scene->gridLayers + iVar7) * 0xc + 5;
              pVVar2 = (vertexData->
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pVVar2[iVar9].m_data[0] = fVar13;
              pVVar2[iVar9].m_data[1] = fVar12;
              pVVar2[iVar9].m_data[2] = 0.0;
              pVVar2[iVar9].m_data[3] = 1.0;
              uVar3 = ppuVar8[1];
              pVVar2 = (vertexData->
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       )._M_impl.super__Vector_impl_data._M_start +
                       (((scene->gridWidth * iVar4 + iVar5) * scene->gridLayers + iVar7) * 0xc + 6);
              *(undefined1 **)pVVar2->m_data = *ppuVar8;
              *(undefined8 *)(pVVar2->m_data + 2) = uVar3;
              iVar9 = ((scene->gridWidth * iVar4 + iVar5) * scene->gridLayers + iVar7) * 0xc + 7;
              pVVar2 = (vertexData->
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pVVar2[iVar9].m_data[0] = fVar11;
              pVVar2[iVar9].m_data[1] = fVar10;
              pVVar2[iVar9].m_data[2] = 0.0;
              pVVar2[iVar9].m_data[3] = 1.0;
              uVar3 = ppuVar8[1];
              pVVar2 = (vertexData->
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       )._M_impl.super__Vector_impl_data._M_start +
                       (((scene->gridWidth * iVar4 + iVar5) * scene->gridLayers + iVar7) * 0xc + 8);
              *(undefined1 **)pVVar2->m_data = *ppuVar8;
              *(undefined8 *)(pVVar2->m_data + 2) = uVar3;
              iVar9 = ((scene->gridWidth * iVar4 + iVar5) * scene->gridLayers + iVar7) * 0xc + 9;
              pVVar2 = (vertexData->
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pVVar2[iVar9].m_data[0] = fVar13;
              pVVar2[iVar9].m_data[1] = fVar12;
              pVVar2[iVar9].m_data[2] = 0.0;
              pVVar2[iVar9].m_data[3] = 1.0;
              uVar3 = ppuVar8[1];
              pVVar2 = (vertexData->
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       )._M_impl.super__Vector_impl_data._M_start +
                       (((scene->gridWidth * iVar4 + iVar5) * scene->gridLayers + iVar7) * 0xc + 10)
              ;
              *(undefined1 **)pVVar2->m_data = *ppuVar8;
              *(undefined8 *)(pVVar2->m_data + 2) = uVar3;
              iVar9 = ((scene->gridWidth * iVar4 + iVar5) * scene->gridLayers + iVar7) * 0xc + 0xb;
              pVVar2 = (vertexData->
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pVVar2[iVar9].m_data[0] = fVar13;
              pVVar2[iVar9].m_data[1] = fVar10;
              pVVar2[iVar9].m_data[2] = 0.0;
              pVVar2[iVar9].m_data[3] = 1.0;
              iVar7 = iVar7 + 1;
              iVar9 = scene->gridLayers;
            } while (iVar7 < iVar9);
          }
          iVar5 = iVar5 + 1;
          iVar6 = iVar6 + 1;
        } while (iVar5 < scene->gridWidth);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < scene->gridHeight);
  }
  return;
}

Assistant:

static void generateLayeredGridVertexAttribData4C4V (std::vector<tcu::Vec4>& vertexData, const LayeredGridSpec& scene)
{
	// interleave color & vertex data
	const tcu::Vec4 green	(0.0f, 1.0f, 0.0f, 0.7f);
	const tcu::Vec4 yellow	(1.0f, 1.0f, 0.0f, 0.8f);

	vertexData.resize(getLayeredGridNumVertices(scene) * 2);

	for (int cellY = 0; cellY < scene.gridHeight; ++cellY)
	for (int cellX = 0; cellX < scene.gridWidth; ++cellX)
	for (int cellZ = 0; cellZ < scene.gridLayers; ++cellZ)
	{
		const tcu::Vec4	color		= (((cellX + cellY + cellZ) % 2) == 0) ? (green) : (yellow);
		const float		cellLeft	= (float(cellX  ) / (float)scene.gridWidth  - 0.5f) * 2.0f;
		const float		cellRight	= (float(cellX+1) / (float)scene.gridWidth  - 0.5f) * 2.0f;
		const float		cellTop		= (float(cellY+1) / (float)scene.gridHeight - 0.5f) * 2.0f;
		const float		cellBottom	= (float(cellY  ) / (float)scene.gridHeight - 0.5f) * 2.0f;

		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  0] = color;
		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  1] = tcu::Vec4(cellLeft, cellTop, 0.0f, 1.0f);

		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  2] = color;
		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  3] = tcu::Vec4(cellLeft, cellBottom, 0.0f, 1.0f);

		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  4] = color;
		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  5] = tcu::Vec4(cellRight, cellBottom, 0.0f, 1.0f);

		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  6] = color;
		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  7] = tcu::Vec4(cellLeft, cellTop, 0.0f, 1.0f);

		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  8] = color;
		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  9] = tcu::Vec4(cellRight, cellBottom, 0.0f, 1.0f);

		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 + 10] = color;
		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 + 11] = tcu::Vec4(cellRight, cellTop, 0.0f, 1.0f);
	}
}